

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

string_view __thiscall slang::SourceManager::getRawFileName(SourceManager *this,BufferID buffer)

{
  pointer pvVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer pvVar4;
  char *pcVar5;
  size_t sVar6;
  string_view sVar7;
  
  uVar3 = (ulong)buffer.id;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  if ((buffer.id == 0) ||
     (pvVar1 = (this->bufferEntries).
               super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (ulong)((long)(this->bufferEntries).
                   super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 6) <= uVar3)) {
    pvVar4 = (pointer)0x0;
  }
  else {
    pvVar4 = (pointer)0x0;
    if (*(__index_type *)
         ((long)&pvVar1[uVar3].
                 super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                 .
                 super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                 .
                 super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
         + 0x38) == '\0') {
      pvVar4 = pvVar1 + uVar3;
    }
  }
  pcVar5 = "";
  if ((pvVar4 == (pointer)0x0) ||
     (puVar2 = *(undefined8 **)
                &(pvVar4->
                 super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                 ).
                 super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                 .
                 super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
     , puVar2 == (undefined8 *)0x0)) {
    sVar6 = 0;
  }
  else {
    pcVar5 = (char *)*puVar2;
    sVar6 = puVar2[1];
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  sVar7._M_str = pcVar5;
  sVar7._M_len = sVar6;
  return sVar7;
}

Assistant:

std::string_view SourceManager::getRawFileName(BufferID buffer) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    auto info = getFileInfo(buffer, lock);
    if (!info || !info->data)
        return "";

    return info->data->name;
}